

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brng.c
# Opt level: O2

void brngBlockInc(octet *block)

{
  long *plVar1;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    plVar1 = (long *)(block + uVar2 * 8);
    *plVar1 = *plVar1 + 1;
    if (3 < uVar2) {
      return;
    }
    uVar2 = uVar2 + 1;
  } while (*plVar1 == 0);
  return;
}

Assistant:

static void brngBlockInc(octet block[32])
{
	register size_t i = 0;
	word* w = (word*)block;
	do
	{
#if (OCTET_ORDER == BIG_ENDIAN)
		w[i] = wordRev(w[i]);
		++w[i];
		w[i] = wordRev(w[i]);
#else
		++w[i];
#endif
	}
	while (w[i] == 0 && i++ < W_OF_O(32));
	i = 0;
}